

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall cmCursesLongMessageForm::UpdateStatusBar(cmCursesLongMessageForm *this)

{
  char *pcVar1;
  size_t sVar2;
  int local_4e0;
  int local_4dc;
  undefined2 local_4cb;
  undefined1 local_4c9;
  ulong uStack_4c8;
  char fmt_s [3];
  size_t i_1;
  size_t sideSpace;
  char vertmp [128];
  char version [512];
  int local_22c;
  ulong uStack_228;
  int width;
  size_t i;
  size_t size;
  char bar [512];
  int y;
  int x;
  cmCursesLongMessageForm *this_local;
  
  if (_stdscr == 0) {
    local_4dc = -1;
  }
  else {
    local_4dc = *(short *)(_stdscr + 4) + 1;
  }
  bar[0x1f8] = (undefined1)local_4dc;
  bar[0x1f9] = local_4dc._1_1_;
  bar[0x1fa] = local_4dc._2_1_;
  bar[0x1fb] = local_4dc._3_1_;
  if (_stdscr == 0) {
    local_4e0 = -1;
  }
  else {
    local_4e0 = *(short *)(_stdscr + 6) + 1;
  }
  bar[0x1fc] = (undefined1)local_4e0;
  bar[0x1fd] = local_4e0._1_1_;
  bar[0x1fe] = local_4e0._2_1_;
  bar[0x1ff] = local_4e0._3_1_;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  i = strlen(pcVar1);
  if (0x1ff < i) {
    i = 0x1ff;
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  strncpy((char *)&size,pcVar1,i);
  for (uStack_228 = i - 1; uStack_228 < 0x200; uStack_228 = uStack_228 + 1) {
    bar[uStack_228 - 8] = ' ';
  }
  if ((int)bar._508_4_ < 0x200) {
    local_22c._0_1_ = bar[0x1fc];
    local_22c._1_1_ = bar[0x1fd];
    local_22c._2_1_ = bar[0x1fe];
    local_22c._3_1_ = bar[0x1ff];
  }
  else {
    local_22c = 0x1ff;
  }
  bar[(long)local_22c + -8] = '\0';
  pcVar1 = cmVersion::GetCMakeVersion();
  sprintf((char *)&sideSpace,"CMake Version %s",pcVar1);
  sVar2 = strlen((char *)&sideSpace);
  for (uStack_4c8 = 0; uStack_4c8 < (long)local_22c - sVar2; uStack_4c8 = uStack_4c8 + 1) {
    vertmp[uStack_4c8 + 0x78] = ' ';
  }
  sprintf(vertmp + ((long)local_22c - sVar2) + 0x78,"%s",&sideSpace);
  vertmp[(long)local_22c + 0x78] = '\0';
  local_4cb = 0x7325;
  local_4c9 = 0;
  curses_move(bar._504_4_ - 4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(&local_4cb,&size);
  wattr_off(_stdscr,0x10000,0);
  curses_move(bar._504_4_ - 3,0);
  printw(&local_4cb,vertmp + 0x78);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateStatusBar()
{
  int x,y;
  getmaxyx(stdscr, y, x);

  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t size = strlen(this->Title.c_str());
  if ( size >= cmCursesMainForm::MAX_WIDTH )
    {
    size = cmCursesMainForm::MAX_WIDTH-1;
    }
  strncpy(bar, this->Title.c_str(), size);
  for(size_t i=size-1; i<cmCursesMainForm::MAX_WIDTH; i++) bar[i] = ' ';

  int width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH-1;
    }

  bar[width] = '\0';

  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(size_t i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  char fmt_s[] = "%s";
  curses_move(y-4,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-3,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}